

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLcode multi_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  connectdata *pcVar1;
  _func_CURLcode_Curl_easy_ptr_CURLcode__Bool *p_Var2;
  uint in_EAX;
  int iVar3;
  CURLcode CVar4;
  CURLcode CVar5;
  CURLcode CVar6;
  undefined4 uStack_38;
  multi_done_ctx mdctx;
  
  pcVar1 = data->conn;
  _uStack_38 = (ulong)in_EAX;
  CVar5 = CURLE_OK;
  if (((data->state).field_0x775 & 4) == 0) {
    Curl_resolver_kill(data);
    (*Curl_cfree)((data->req).newurl);
    (data->req).newurl = (char *)0x0;
    (*Curl_cfree)((data->req).location);
    (data->req).location = (char *)0x0;
    if ((status < CURLE_BAD_FUNCTION_ARGUMENT) &&
       ((0x40004800000U >> ((ulong)status & 0x3f) & 1) != 0)) {
      premature = true;
    }
    p_Var2 = pcVar1->handler->done;
    if (p_Var2 != (_func_CURLcode_Curl_easy_ptr_CURLcode__Bool *)0x0) {
      status = (*p_Var2)(data,status,premature);
    }
    if (status == CURLE_ABORTED_BY_CALLBACK) {
      CVar6 = CURLE_ABORTED_BY_CALLBACK;
    }
    else {
      iVar3 = Curl_pgrsDone(data);
      CVar6 = CURLE_ABORTED_BY_CALLBACK;
      if (iVar3 == 0) {
        CVar6 = status;
      }
      if (status != CURLE_OK) {
        CVar6 = status;
      }
    }
    CVar4 = Curl_xfer_write_done(data,premature);
    CVar5 = CVar4;
    if (CVar6 != CURLE_OK) {
      CVar5 = CVar6;
    }
    if (CVar4 == CURLE_OK) {
      CVar5 = CVar6;
    }
    Curl_conn_ev_data_done(data,premature);
    process_pending_handles(data->multi);
    if (CVar5 == CURLE_OK) {
      CVar5 = Curl_req_done(&data->req,data,premature);
    }
    _uStack_38 = CONCAT14(premature,uStack_38);
    Curl_cpool_do_locked(data,data->conn,multi_done_locked,&mdctx);
    Curl_netrc_cleanup(&(data->state).netrc);
  }
  return CVar5;
}

Assistant:

static CURLcode multi_done(struct Curl_easy *data,
                           CURLcode status,  /* an error if this is called
                                                after an error was detected */
                           bool premature)
{
  CURLcode result, r2;
  struct connectdata *conn = data->conn;
  struct multi_done_ctx mdctx;

  memset(&mdctx, 0, sizeof(mdctx));

#if defined(DEBUGBUILD) && !defined(CURL_DISABLE_VERBOSE_STRINGS)
  DEBUGF(infof(data, "multi_done[%s]: status: %d prem: %d done: %d",
               multi_statename[data->mstate],
               (int)status, (int)premature, data->state.done));
#else
  DEBUGF(infof(data, "multi_done: status: %d prem: %d done: %d",
               (int)status, (int)premature, data->state.done));
#endif

  if(data->state.done)
    /* Stop if multi_done() has already been called */
    return CURLE_OK;

  /* Stop the resolver and free its own resources (but not dns_entry yet). */
  Curl_resolver_kill(data);

  /* Cleanup possible redirect junk */
  Curl_safefree(data->req.newurl);
  Curl_safefree(data->req.location);

  switch(status) {
  case CURLE_ABORTED_BY_CALLBACK:
  case CURLE_READ_ERROR:
  case CURLE_WRITE_ERROR:
    /* When we are aborted due to a callback return code it basically have to
       be counted as premature as there is trouble ahead if we do not. We have
       many callbacks and protocols work differently, we could potentially do
       this more fine-grained in the future. */
    premature = TRUE;
    FALLTHROUGH();
  default:
    break;
  }

  /* this calls the protocol-specific function pointer previously set */
  if(conn->handler->done)
    result = conn->handler->done(data, status, premature);
  else
    result = status;

  if(CURLE_ABORTED_BY_CALLBACK != result) {
    /* avoid this if we already aborted by callback to avoid this calling
       another callback */
    int rc = Curl_pgrsDone(data);
    if(!result && rc)
      result = CURLE_ABORTED_BY_CALLBACK;
  }

  /* Make sure that transfer client writes are really done now. */
  r2 = Curl_xfer_write_done(data, premature);
  if(r2 && !result)
    result = r2;

  /* Inform connection filters that this transfer is done */
  Curl_conn_ev_data_done(data, premature);

  process_pending_handles(data->multi); /* connection / multiplex */

  if(!result)
    result = Curl_req_done(&data->req, data, premature);

  /* Under the potential connection pool's share lock, decide what to
   * do with the transfer's connection. */
  mdctx.premature = premature;
  Curl_cpool_do_locked(data, data->conn, multi_done_locked, &mdctx);

  /* flush the netrc cache */
  Curl_netrc_cleanup(&data->state.netrc);
  return result;
}